

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContainTest.h
# Opt level: O2

void __thiscall
oout::ContainTest::ContainTest<std::shared_ptr<oout::ContainMatch>>
          (ContainTest *this,shared_ptr<const_oout::Text> *text,string *sub,
          shared_ptr<oout::ContainMatch> *subs)

{
  shared_ptr<const_oout::Match> sStack_58;
  undefined1 local_48 [40];
  
  std::__shared_ptr<oout::Match_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<oout::ContainMatch,void>
            ((__shared_ptr<oout::Match_const,(__gnu_cxx::_Lock_policy)2> *)&sStack_58,
             &subs->super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>);
  std::make_shared<oout::ContainMatch,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  local_48._16_8_ = local_48._0_8_;
  local_48._24_8_ = local_48._8_8_;
  local_48._0_8_ = (pointer)0x0;
  local_48._8_8_ = 0;
  ContainTest<>(this,text,&sStack_58,(shared_ptr<const_oout::Match> *)(local_48 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 0x18));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sStack_58.super___shared_ptr<const_oout::Match,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

ContainTest(
		const std::shared_ptr<const Text> &text,
		const std::string &sub,
		S ... subs
	) : ContainTest(text, subs..., std::make_shared<ContainMatch>(sub))
	{
	}